

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.h
# Opt level: O0

void __thiscall inject::no_component::no_component(no_component *this,string *name)

{
  ostream *poVar1;
  string local_1c0 [32];
  stringstream local_1a0 [8];
  stringstream oss;
  ostream local_190 [376];
  string *local_18;
  string *name_local;
  no_component *this_local;
  
  local_18 = name;
  name_local = (string *)this;
  std::exception::exception(&this->super_exception);
  *(undefined ***)this = &PTR__no_component_00133758;
  this->_id = -1;
  std::__cxx11::string::string((string *)&this->_name,(string *)local_18);
  std::__cxx11::string::string((string *)&this->_msg);
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"no such component \'");
  poVar1 = std::operator<<(poVar1,(string *)local_18);
  std::operator<<(poVar1,"\'");
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=((string *)&this->_msg,local_1c0);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

no_component(const std::string& name) throw() :
            exception(), _id(INVALID_ID), _name(name) {
        std::stringstream oss;
        oss << "no such component '" << name << "'";
        _msg = oss.str();
    }